

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

void tcd_makelayer(opj_tcd_t *tcd,int layno,double thresh,int final)

{
  opj_tcd_cblk_enc_t *poVar1;
  uint uVar2;
  opj_tcd_tile_t *poVar3;
  opj_tcd_tilecomp_t *poVar4;
  opj_tcd_resolution_t *poVar5;
  opj_tcd_precinct_t *poVar6;
  opj_tcd_cblk_enc_t *poVar7;
  opj_tcd_pass_t *poVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  OPJ_UINT32 OVar20;
  ulong uVar21;
  uchar *puVar22;
  int iVar23;
  uint uVar24;
  opj_tcd_layer_t *poVar25;
  int iVar26;
  ulong uVar27;
  double dVar28;
  
  poVar3 = tcd->tcd_tile;
  poVar3->distolayer[layno] = 0.0;
  uVar9 = poVar3->numcomps;
  if (poVar3->numcomps < 1) {
    uVar9 = 0;
  }
  for (uVar15 = 0; uVar15 != uVar9; uVar15 = uVar15 + 1) {
    poVar4 = poVar3->comps;
    uVar2 = poVar4[uVar15].numresolutions;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    for (uVar14 = 0; uVar14 != uVar2; uVar14 = uVar14 + 1) {
      poVar5 = poVar4[uVar15].resolutions;
      uVar10 = poVar5[uVar14].numbands;
      if (poVar5[uVar14].numbands < 1) {
        uVar10 = 0;
      }
      for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
        uVar19 = poVar5[uVar14].ph * poVar5[uVar14].pw;
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar19; uVar12 = uVar12 + 1) {
          poVar6 = poVar5[uVar14].bands[uVar13].precincts;
          uVar24 = poVar6[uVar12].ch * poVar6[uVar12].cw;
          if ((int)uVar24 < 1) {
            uVar24 = 0;
          }
          for (uVar16 = 0; uVar16 != uVar24; uVar16 = uVar16 + 1) {
            poVar7 = poVar6[uVar12].cblks.enc;
            poVar1 = poVar7 + uVar16;
            if (layno == 0) {
              poVar1->numpassesinlayers = 0;
              uVar18 = 0;
            }
            else {
              uVar18 = (ulong)(uint)poVar1->numpassesinlayers;
            }
            poVar25 = poVar7[uVar16].layers + layno;
            iVar26 = (int)uVar18;
            uVar21 = (ulong)iVar26;
            uVar27 = uVar21;
            while( true ) {
              uVar17 = (uint)uVar18;
              if ((long)poVar1->totalpasses <= (long)uVar27) break;
              poVar8 = poVar1->passes;
              iVar23 = poVar8[uVar27].rate;
              if (uVar17 == 0) {
                dVar28 = poVar8[uVar27].distortiondec;
              }
              else {
                iVar23 = iVar23 - poVar8[(long)(int)uVar17 + -1].rate;
                dVar28 = poVar8[uVar27].distortiondec - poVar8[(long)(int)uVar17 + -1].distortiondec
                ;
              }
              if (iVar23 == 0) {
                uVar27 = uVar27 + 1;
                uVar11 = (uint)uVar27;
                if (dVar28 == 0.0) {
                  uVar11 = uVar17;
                }
                uVar18 = (ulong)uVar11;
              }
              else {
                uVar27 = uVar27 + 1;
                if (thresh <= dVar28 / (double)iVar23) {
                  uVar18 = uVar27 & 0xffffffff;
                }
              }
            }
            poVar25->numpasses = uVar17 - iVar26;
            if (uVar17 - iVar26 == 0) {
              poVar25->disto = 0.0;
            }
            else {
              iVar23 = uVar17 - 1;
              poVar8 = poVar1->passes;
              OVar20 = poVar8[iVar23].rate;
              if (iVar26 == 0) {
                puVar22 = poVar1->data;
                dVar28 = poVar8[iVar23].distortiondec;
              }
              else {
                OVar20 = OVar20 - poVar8[uVar21 - 1].rate;
                puVar22 = poVar1->data + poVar8[uVar21 - 1].rate;
                dVar28 = poVar8[iVar23].distortiondec - poVar8[uVar21 - 1].distortiondec;
              }
              poVar25->len = OVar20;
              poVar25->data = puVar22;
              poVar25->disto = (OPJ_FLOAT64)dVar28;
              poVar3->distolayer[layno] = dVar28 + poVar3->distolayer[layno];
              if (final != 0) {
                poVar1->numpassesinlayers = uVar17;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void tcd_makelayer(opj_tcd_t *tcd, int layno, double thresh, int final) {
	int compno, resno, bandno, precno, cblkno, passno;
	
	opj_tcd_tile_t *tcd_tile = tcd->tcd_tile;

	tcd_tile->distolayer[layno] = 0;	/* fixed_quality */
	
	for (compno = 0; compno < tcd_tile->numcomps; compno++) {
		opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];
		for (resno = 0; resno < tilec->numresolutions; resno++) {
			opj_tcd_resolution_t *res = &tilec->resolutions[resno];
			for (bandno = 0; bandno < res->numbands; bandno++) {
				opj_tcd_band_t *band = &res->bands[bandno];
				for (precno = 0; precno < res->pw * res->ph; precno++) {
					opj_tcd_precinct_t *prc = &band->precincts[precno];
					for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
						opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];
						opj_tcd_layer_t *layer = &cblk->layers[layno];
						
						int n;
						if (layno == 0) {
							cblk->numpassesinlayers = 0;
						}
						n = cblk->numpassesinlayers;
						for (passno = cblk->numpassesinlayers; passno < cblk->totalpasses; passno++) {
							int dr;
							double dd;
							opj_tcd_pass_t *pass = &cblk->passes[passno];
							if (n == 0) {
								dr = pass->rate;
								dd = pass->distortiondec;
							} else {
								dr = pass->rate - cblk->passes[n - 1].rate;
								dd = pass->distortiondec - cblk->passes[n - 1].distortiondec;
							}
							if (!dr) {
								if (dd != 0)
									n = passno + 1;
								continue;
							}
							if (dd / dr >= thresh)
								n = passno + 1;
						}
						layer->numpasses = n - cblk->numpassesinlayers;
						
						if (!layer->numpasses) {
							layer->disto = 0;
							continue;
						}
						if (cblk->numpassesinlayers == 0) {
							layer->len = cblk->passes[n - 1].rate;
							layer->data = cblk->data;
							layer->disto = cblk->passes[n - 1].distortiondec;
						} else {
							layer->len = cblk->passes[n - 1].rate -	cblk->passes[cblk->numpassesinlayers - 1].rate;
							layer->data = cblk->data + cblk->passes[cblk->numpassesinlayers - 1].rate;
							layer->disto = cblk->passes[n - 1].distortiondec - cblk->passes[cblk->numpassesinlayers - 1].distortiondec;
						}
						
						tcd_tile->distolayer[layno] += layer->disto;	/* fixed_quality */
						
						if (final)
							cblk->numpassesinlayers = n;
					}
				}
			}
		}
	}
}